

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sshproxy.c
# Opt level: O0

SeatPromptResult *
sshproxy_confirm_ssh_host_key
          (SeatPromptResult *__return_storage_ptr__,Seat *seat,char *host,int port,char *keytype,
          char *keystr,SeatDialogText *text,HelpCtx helpctx,
          _func_void_void_ptr_SeatPromptResult *callback,void *ctx)

{
  InteractionReadySeat iseat;
  SshProxy *sp;
  char *keystr_local;
  char *keytype_local;
  int port_local;
  char *host_local;
  Seat *seat_local;
  
  if (seat[-0x411].vt == (SeatVtable *)0x0) {
    make_spr_sw_abort_static
              (__return_storage_ptr__,"Noninteractive SSH proxy cannot confirm host key");
  }
  else {
    iseat = wrap((Seat *)seat[-0x411].vt);
    seat_confirm_ssh_host_key
              (__return_storage_ptr__,iseat,host,port,keytype,keystr,text,helpctx,callback,ctx);
  }
  return __return_storage_ptr__;
}

Assistant:

static SeatPromptResult sshproxy_confirm_ssh_host_key(
    Seat *seat, const char *host, int port, const char *keytype,
    char *keystr, SeatDialogText *text, HelpCtx helpctx,
    void (*callback)(void *ctx, SeatPromptResult result), void *ctx)
{
    SshProxy *sp = container_of(seat, SshProxy, seat);

    if (sp->clientseat) {
        /*
         * If we have access to the outer Seat, pass this prompt
         * request on to it.
         */
        return seat_confirm_ssh_host_key(
            wrap(sp->clientseat), host, port, keytype, keystr, text,
            helpctx, callback, ctx);
    }

    /*
     * Otherwise, behave as if we're in batch mode, i.e. take the safe
     * option in the absence of interactive confirmation, i.e. abort
     * the connection.
     */
    return SPR_SW_ABORT("Noninteractive SSH proxy cannot confirm host key");
}